

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

bool __thiscall
llvm::cl::
OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
compare(OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (this->Valid != true) {
    return false;
  }
  __n = (this->Value)._M_string_length;
  bVar2 = true;
  if (__n == V->_M_string_length) {
    if (__n == 0) {
      return false;
    }
    iVar1 = bcmp((this->Value)._M_dataplus._M_p,(V->_M_dataplus)._M_p,__n);
    bVar2 = iVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool compare(const DataType &V) const { return Valid && (Value != V); }